

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

void __thiscall BinGE<0,_4,_1>::BinGE(BinGE<0,_4,_1> *this,IntView<0> _x,IntView<4> _y,BoolView *_r)

{
  IntVar *pIVar1;
  BinGE<0,_4,_1> *local_38;
  
  pIVar1 = _x.var;
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Propagator_0020be88;
  (this->super_Propagator).prop_id = engine.propagators.sz;
  (this->super_Propagator).priority = 0;
  (this->super_Propagator).satisfied = '\0';
  (this->super_Propagator).in_queue = false;
  local_38 = this;
  vec<Propagator_*>::push(&engine.propagators,(Propagator **)&local_38);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__BinGE_0020f0a0;
  (this->x).var = pIVar1;
  (this->x).a = (int)_x._8_8_;
  (this->x).b = (int)((ulong)_x._8_8_ >> 0x20);
  (this->y).var = _y.var;
  (this->y).a = (int)_y._8_8_;
  (this->y).b = (int)((ulong)_y._8_8_ >> 0x20);
  (this->r).super_Var.super_Branching._vptr_Branching = (_func_int **)&PTR_finished_0020bb98;
  (this->r).v = _r->v;
  (this->r).s = _r->s;
  (*(pIVar1->super_Var).super_Branching._vptr_Branching[7])(pIVar1,this,0,4);
  pIVar1 = (this->y).var;
  (*(pIVar1->super_Var).super_Branching._vptr_Branching[7])(pIVar1,this,1,2);
  BoolView::attach(&this->r,&this->super_Propagator,2,2);
  return;
}

Assistant:

BinGE(IntView<U> _x, IntView<V> _y, BoolView _r = bv_true) : x(_x), y(_y), r(std::move(_r)) {
		x.attach(this, 0, EVENT_U);
		y.attach(this, 1, EVENT_L);
		if (R != 0) {
			r.attach(this, 2, EVENT_L);
		}
	}